

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O2

string * __thiscall
IntegratorXX::Matchers::WithinAbsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinAbsMatcher *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 6;
  std::operator<<((ostream *)&local_188," is not within ");
  poVar1 = std::ostream::_M_insert<double>(this->m_margin);
  std::operator<<(poVar1," of ");
  poVar1 = std::ostream::_M_insert<double>(this->m_target);
  poVar1 = std::operator<<(poVar1,"\n(");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_msg);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinAbsMatcher::describe() const {
        std::stringstream ss;
        ss << std::scientific;
        ss << std::setprecision(6);
        ss << " is not within " << m_margin << " of " << m_target << "\n(" << m_msg << ")";
        return ss.str();
    }